

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O3

void pltcalc::
     domeanout<pltcalc::outrec_granular,std::map<int,std::vector<period_occ_granular,std::allocator<period_occ_granular>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ_granular,std::allocator<period_occ_granular>>>>>,period_occ_granular>
               (summarySampleslevelHeader *sh,OASIS_FLOAT mean_val,
               _func_void_outrec_granular_ptr_int_FILE_ptr *OutputData,FILE *outFile,
               map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
               *m_occ,vector<period_occ_granular,_std::allocator<period_occ_granular>_> *vp,
               OASIS_FLOAT chance_of_loss,OASIS_FLOAT max_loss)

{
  pointer ppVar1;
  mapped_type *__x;
  pointer ppVar2;
  outrec_granular o;
  outrec_granular local_60;
  
  __x = std::
        map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
        ::operator[](m_occ,&sh->event_id);
  std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>::operator=(vp,__x);
  local_60.event_id = sh->event_id;
  local_60.summary_id = sh->summary_id;
  local_60.exp_value = sh->expval;
  local_60.standard_deviation = 0.0;
  ppVar2 = (vp->super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (vp->super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar2 != ppVar1) {
    local_60.mean = mean_val;
    local_60.max_impact_exp = local_60.exp_value;
    local_60.mean_impact_exp = local_60.exp_value;
    local_60.chance_of_loss = chance_of_loss;
    local_60.max_loss = max_loss;
    do {
      if (0.0 < local_60.mean) {
        local_60.occ_date_id = ppVar2->occ_date_id;
        local_60.period_no = ppVar2->period_no;
        (*OutputData)(&local_60,1,outFile);
      }
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != ppVar1);
  }
  return;
}

Assistant:

void domeanout(const summarySampleslevelHeader& sh,
		       OASIS_FLOAT mean_val,
		       void (*OutputData)(const outrecT&, const int, FILE*),
		       FILE * outFile, moccT &m_occ, std::vector<periodT> &vp,
		       const OASIS_FLOAT chance_of_loss,
		       const OASIS_FLOAT max_loss)
	{
		vp = m_occ[sh.event_id];
		outrecT o;
		o.event_id = sh.event_id;
		o.summary_id = sh.summary_id;
		o.exp_value = sh.expval;
		o.max_impact_exp = sh.expval;
		o.mean_impact_exp = sh.expval;
		o.chance_of_loss = chance_of_loss;
		o.max_loss = max_loss;
		o.mean = mean_val;
		o.standard_deviation = 0;
		for (auto p : vp) {
			if (o.mean > 0) {
				o.period_no = p.period_no;
				o.occ_date_id = p.occ_date_id;
				OutputData(o, 1, outFile);
			}
		}
	}